

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_set_failure_nullptr_fn(int _i)

{
  bool bVar1;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  undefined8 uStack_20;
  char c;
  private_ACUtilsTest_ADynArray_CharArray *arrayPtr;
  int _i_local;
  
  uStack_20 = 0;
  private_ACUtilsTest_ADynArray_reallocFail = false;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  _ck_x._7_1_ = 0x30;
  arrayPtr._4_4_ = _i;
  bVar1 = private_ACUtils_ADynArray_setRange((void *)0x0,0,1,(void *)((long)&_ck_x + 7),1);
  if ((ulong)bVar1 != 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6ae,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_setRange(arrayPtr, 0, 1, &(c), sizeof(*(arrayPtr)->buffer)) == false"
                      ,
                      "private_ACUtils_ADynArray_setRange(arrayPtr, 0, 1, &(c), sizeof(*(arrayPtr)->buffer))"
                      ,(ulong)bVar1,"false",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x6ae);
  if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x6af);
    return;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x6af,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                    "private_ACUtilsTest_ADynArray_reallocCount == 0",
                    "private_ACUtilsTest_ADynArray_reallocCount",
                    private_ACUtilsTest_ADynArray_reallocCount,"0",0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_set_failure_nullptr)
{
    struct private_ACUtilsTest_ADynArray_CharArray *arrayPtr = nullptr;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_set(arrayPtr, 0, c), false);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
}